

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta.cpp
# Opt level: O0

void cpp_client::morph_any(Any *to_morph,Value *val)

{
  Value *this;
  bool bVar1;
  int iVar2;
  type_info *ptVar3;
  type pbVar4;
  type piVar5;
  Ch *pCVar6;
  type this_00;
  Bad_manipulation *pBVar7;
  type pdVar8;
  Bad_response *this_01;
  double dVar9;
  shared_ptr<cpp_client::Base_object> local_c8;
  double local_b8;
  Any local_b0;
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [32];
  Any local_58;
  int local_4c;
  Any local_48;
  bool local_39;
  Any local_38 [3];
  byte local_19;
  Value *pVStack_18;
  bool no_type;
  Value *val_local;
  Any *to_morph_local;
  
  pVStack_18 = val;
  val_local = (Value *)to_morph;
  ptVar3 = Any::type(to_morph);
  local_19 = std::type_info::operator==(ptVar3,(type_info *)&void::typeinfo);
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsBool(pVStack_18);
  if (bVar1) {
    if ((local_19 & 1) == 0) {
      ptVar3 = Any::type((Any *)val_local);
      bVar1 = std::type_info::operator!=(ptVar3,(type_info *)&bool::typeinfo);
      if (bVar1) {
        pBVar7 = (Bad_manipulation *)__cxa_allocate_exception(0x10);
        Bad_manipulation::runtime_error(pBVar7,"Boolean assigned to non-Boolean.");
        __cxa_throw(pBVar7,&Bad_manipulation::typeinfo,Bad_manipulation::~Bad_manipulation);
      }
    }
    if ((local_19 & 1) == 0) {
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetBool(pVStack_18);
      pbVar4 = Any::as<bool>((Any *)val_local);
      *pbVar4 = bVar1;
    }
    else {
      local_39 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetBool(pVStack_18);
      Any::Any<bool>(local_38,&local_39);
      Any::operator=((Any *)val_local,local_38);
      Any::~Any(local_38);
    }
  }
  else {
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsInt(pVStack_18);
    if (bVar1) {
      ptVar3 = Any::type((Any *)val_local);
      bVar1 = std::type_info::operator!=(ptVar3,(type_info *)&double::typeinfo);
      if (bVar1) {
        if ((local_19 & 1) == 0) {
          ptVar3 = Any::type((Any *)val_local);
          bVar1 = std::type_info::operator!=(ptVar3,(type_info *)&int::typeinfo);
          if (bVar1) {
            pBVar7 = (Bad_manipulation *)__cxa_allocate_exception(0x10);
            Bad_manipulation::runtime_error(pBVar7,"Integer assigned to non-Integer.");
            __cxa_throw(pBVar7,&Bad_manipulation::typeinfo,Bad_manipulation::~Bad_manipulation);
          }
        }
        if ((local_19 & 1) != 0) {
          local_4c = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::GetInt(pVStack_18);
          Any::Any<int>(&local_48,&local_4c);
          Any::operator=((Any *)val_local,&local_48);
          Any::~Any(&local_48);
          return;
        }
        iVar2 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetInt(pVStack_18);
        piVar5 = Any::as<int>((Any *)val_local);
        *piVar5 = iVar2;
        return;
      }
    }
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsString(pVStack_18);
    if (bVar1) {
      if ((local_19 & 1) == 0) {
        ptVar3 = Any::type((Any *)val_local);
        bVar1 = std::type_info::operator!=(ptVar3,(type_info *)&std::__cxx11::string::typeinfo);
        if (bVar1) {
          pBVar7 = (Bad_manipulation *)__cxa_allocate_exception(0x10);
          Bad_manipulation::runtime_error(pBVar7,"String assigned to non-string.");
          __cxa_throw(pBVar7,&Bad_manipulation::typeinfo,Bad_manipulation::~Bad_manipulation);
        }
      }
      if ((local_19 & 1) == 0) {
        pCVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(pVStack_18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a0,pCVar6,&local_a1);
        this_00 = Any::as<std::__cxx11::string>((Any *)val_local);
        std::__cxx11::string::operator=((string *)this_00,local_a0);
        std::__cxx11::string::~string(local_a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      }
      else {
        pCVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(pVStack_18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_78,pCVar6,&local_79);
        Any::Any<std::__cxx11::string>
                  (&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
        Any::operator=((Any *)val_local,&local_58);
        Any::~Any(&local_58);
        std::__cxx11::string::~string(local_78);
        std::allocator<char>::~allocator((allocator<char> *)&local_79);
      }
    }
    else {
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsNumber(pVStack_18);
      if (bVar1) {
        if ((local_19 & 1) == 0) {
          ptVar3 = Any::type((Any *)val_local);
          bVar1 = std::type_info::operator!=(ptVar3,(type_info *)&double::typeinfo);
          if (bVar1) {
            pBVar7 = (Bad_manipulation *)__cxa_allocate_exception(0x10);
            Bad_manipulation::runtime_error(pBVar7,"Double assigned to non-double.");
            __cxa_throw(pBVar7,&Bad_manipulation::typeinfo,Bad_manipulation::~Bad_manipulation);
          }
        }
        if ((local_19 & 1) == 0) {
          dVar9 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::GetDouble(pVStack_18);
          pdVar8 = Any::as<double>((Any *)val_local);
          *pdVar8 = dVar9;
        }
        else {
          local_b8 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::GetDouble(pVStack_18);
          Any::Any<double>(&local_b0,&local_b8);
          Any::operator=((Any *)val_local,&local_b0);
          Any::~Any(&local_b0);
        }
      }
      else {
        bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::IsNull(pVStack_18);
        this = val_local;
        if (!bVar1) {
          this_01 = (Bad_response *)__cxa_allocate_exception(0x10);
          Bad_response::runtime_error(this_01,"Unknown JSON type received in a delta.");
          __cxa_throw(this_01,&Bad_response::typeinfo,Bad_response::~Bad_response);
        }
        std::shared_ptr<cpp_client::Base_object>::shared_ptr(&local_c8,(nullptr_t)0x0);
        Any::reset((Any *)this,&local_c8);
        std::shared_ptr<cpp_client::Base_object>::~shared_ptr(&local_c8);
      }
    }
  }
  return;
}

Assistant:

void morph_any(Any& to_morph, const rapidjson::Value& val)
{
   const bool no_type = (to_morph.type() == typeid(void));
   //otherwise just create the Any from it via this stupid if-else block
   if(val.IsBool())
   {
      if(!no_type && to_morph.type() != typeid(bool))
      {
         throw Bad_manipulation("Boolean assigned to non-Boolean.");
      }
      if(no_type)
      {
         to_morph = Any{val.GetBool()};
      }
      else
      {
         to_morph.as<bool>() = val.GetBool();
      }
   }
   else if(val.IsInt() && to_morph.type() != typeid(double))
   {
      if(!no_type && to_morph.type() != typeid(int))
      {
         throw Bad_manipulation("Integer assigned to non-Integer.");
      }
      if(no_type)
      {
         to_morph = Any{val.GetInt()};
      }
      else
      {
         to_morph.as<int>() = val.GetInt();
      }
   }
   else if(val.IsString())
   {
      if(!no_type && to_morph.type() != typeid(std::string))
      {
         throw Bad_manipulation("String assigned to non-string.");
      }
      if(no_type)
      {
         to_morph = Any{std::string{val.GetString()}};
      }
      else
      {
         to_morph.as<std::string>() = std::string{val.GetString()};
      }
   }
   else if(val.IsNumber())
   {
      if(!no_type && to_morph.type() != typeid(double))
      {
         throw Bad_manipulation("Double assigned to non-double.");
      }
      if(no_type)
      {
         to_morph = Any{static_cast<double>(val.GetDouble())};
      }
      else
      {
         to_morph.as<double>() = static_cast<double>(val.GetDouble());
      }
   }
   else if(val.IsNull())
   {
      to_morph.reset();
   }
   else
   {
      //some kind of weird gross type that's icky
      throw Bad_response("Unknown JSON type received in a delta.");
   }
}